

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall kratos::PortPackedStruct::set_is_packed(PortPackedStruct *this,bool value)

{
  UserException *this_00;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  PortPackedStruct *pPStack_10;
  bool value_local;
  PortPackedStruct *this_local;
  
  if (!value) {
    local_11 = value;
    pPStack_10 = this;
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unable to set packed struct unpacked",&local_39);
    UserException::UserException(this_00,&local_38);
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  return;
}

Assistant:

void PortPackedStruct::set_is_packed(bool value) {
    if (!value) throw UserException("Unable to set packed struct unpacked");
}